

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

Socket * sshproxy_new_connection
                   (SockAddr *addr,char *hostname,int port,_Bool privport,_Bool oobinline,
                   _Bool nodelay,_Bool keepalive,Plug *plug,Conf *clientconf,Interactor *clientitr)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  Conf *pCVar4;
  char *pcVar5;
  LogContext *pLVar6;
  Seat *pSVar7;
  Backend **out;
  char *host;
  LogPolicy *pLVar8;
  char *local_90;
  char *realhost;
  char *error;
  char *cmd;
  Conf *cmd_conf;
  char *pcStack_68;
  int proxy_type;
  char *subkey;
  BackendVtable *backvt;
  char *proxy_password;
  char *proxy_username;
  char *proxy_hostname;
  SshProxy *sp;
  _Bool keepalive_local;
  _Bool nodelay_local;
  _Bool oobinline_local;
  _Bool privport_local;
  int port_local;
  char *hostname_local;
  SockAddr *addr_local;
  
  sp._0_1_ = keepalive;
  sp._1_1_ = nodelay;
  sp._2_1_ = oobinline;
  sp._3_1_ = privport;
  sp._4_4_ = port;
  _keepalive_local = hostname;
  hostname_local = (char *)addr;
  proxy_hostname = (char *)safemalloc(1,0x20b8,0);
  memset(proxy_hostname,0,0x20b8);
  *(SocketVtable **)(proxy_hostname + 0x20a0) = &SshProxy_sock_vt;
  *(LogPolicyVtable **)(proxy_hostname + 0x20a8) = &SshProxy_logpolicy_vt;
  *(SeatVtable **)(proxy_hostname + 0x20b0) = &SshProxy_seat_vt;
  *(Plug **)(proxy_hostname + 0x2050) = plug;
  psb_init((ProxyStderrBuf *)(proxy_hostname + 0x48));
  bufchain_init((bufchain *)(proxy_hostname + 0x2060));
  *(char **)(proxy_hostname + 0x2090) = hostname_local;
  *(int *)(proxy_hostname + 0x2098) = sp._4_4_;
  pCVar4 = conf_new();
  *(Conf **)(proxy_hostname + 8) = pCVar4;
  proxy_username = conf_get_str(clientconf,0xe);
  _Var2 = do_defaults(proxy_username,*(Conf **)(proxy_hostname + 8));
  if (_Var2) {
    _Var2 = conf_launchable(*(Conf **)(proxy_hostname + 8));
    if (!_Var2) {
      pcVar5 = dupprintf("saved session \'%s\' is not launchable",proxy_username);
      *(char **)proxy_hostname = pcVar5;
      return (Socket *)(proxy_hostname + 0x20a0);
    }
  }
  else {
    do_defaults((char *)0x0,*(Conf **)(proxy_hostname + 8));
    conf_set_int(*(Conf **)(proxy_hostname + 8),2,3);
    conf_set_str(*(Conf **)(proxy_hostname + 8),0,proxy_username);
    pCVar4 = *(Conf **)(proxy_hostname + 8);
    iVar3 = conf_get_int(clientconf,0xf);
    conf_set_int(pCVar4,1,iVar3);
  }
  proxy_password = conf_get_str(clientconf,0x10);
  if (*proxy_password != '\0') {
    conf_set_str(*(Conf **)(proxy_hostname + 8),0x39,proxy_password);
  }
  backvt = (BackendVtable *)conf_get_str(clientconf,0x11);
  if (*(char *)&backvt->init != '\0') {
    pcVar5 = dupstr((char *)backvt);
    *(char **)(proxy_hostname + 0x40) = pcVar5;
    proxy_hostname[0x38] = '\x01';
  }
  iVar3 = conf_get_int(*(Conf **)(proxy_hostname + 8),2);
  subkey = (char *)backend_vt_from_proto(iVar3);
  if (((BackendVtable *)subkey == (BackendVtable *)0x0) ||
     ((((BackendVtable *)subkey)->flags & 4) == 0)) {
    pcVar5 = dupprintf("saved session \'%s\' is not an SSH session",proxy_username);
    *(char **)proxy_hostname = pcVar5;
    addr_local = (SockAddr *)(proxy_hostname + 0x20a0);
  }
  else {
    if ((((BackendVtable *)subkey)->flags & 8) == 0) {
      __assert_fail("backvt->flags & BACKEND_NOTIFIES_SESSION_START && \"Backend provides NC_HOST without SESSION_START!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/sshproxy.c"
                    ,0x27e,
                    "Socket *sshproxy_new_connection(SockAddr *, const char *, int, _Bool, _Bool, _Bool, _Bool, Plug *, Conf *, Interactor *)"
                   );
    }
    conf_set_bool(*(Conf **)(proxy_hostname + 8),0xc1,false);
    conf_set_bool(*(Conf **)(proxy_hostname + 8),0xaa,false);
    conf_set_bool(*(Conf **)(proxy_hostname + 8),0x1e,false);
    while (pcStack_68 = conf_get_str_nthstrkey(*(Conf **)(proxy_hostname + 8),0xb0,0),
          pcStack_68 != (char *)0x0) {
      conf_del_str_str(*(Conf **)(proxy_hostname + 8),0xb0,pcStack_68);
    }
    conf_set_bool(*(Conf **)(proxy_hostname + 8),0xbf,true);
    cmd_conf._4_4_ = conf_get_int(clientconf,0xd);
    if (cmd_conf._4_4_ == 6) {
      conf_set_str(*(Conf **)(proxy_hostname + 8),0x33,_keepalive_local);
      conf_set_int(*(Conf **)(proxy_hostname + 8),0x34,sp._4_4_);
    }
    else {
      if (1 < cmd_conf._4_4_ - 7U) {
        __assert_fail("false && \"bad SSH proxy type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/sshproxy.c"
                      ,0x2bd,
                      "Socket *sshproxy_new_connection(SockAddr *, const char *, int, _Bool, _Bool, _Bool, _Bool, Plug *, Conf *, Interactor *)"
                     );
      }
      cmd = (char *)conf_copy(clientconf);
      conf_set_str((Conf *)cmd,0x10,"");
      conf_set_str((Conf *)cmd,0x11,"");
      error = format_telnet_command
                        (*(SockAddr **)(proxy_hostname + 0x2090),*(int *)(proxy_hostname + 0x2098),
                         (Conf *)cmd,(uint *)0x0);
      conf_free((Conf *)cmd);
      conf_set_str(*(Conf **)(proxy_hostname + 8),0x14,error);
      safefree(error);
      conf_set_bool(*(Conf **)(proxy_hostname + 8),0x16,true);
      if (cmd_conf._4_4_ == 8) {
        conf_set_bool(*(Conf **)(proxy_hostname + 8),0x30,true);
      }
    }
    prepare_session(*(Conf **)(proxy_hostname + 8));
    pLVar6 = log_init((LogPolicy *)(proxy_hostname + 0x20a8),*(Conf **)(proxy_hostname + 8));
    pcVar5 = subkey;
    *(LogContext **)(proxy_hostname + 0x10) = pLVar6;
    pSVar7 = (Seat *)(proxy_hostname + 0x20b0);
    out = (Backend **)(proxy_hostname + 0x18);
    pLVar6 = *(LogContext **)(proxy_hostname + 0x10);
    pCVar4 = *(Conf **)(proxy_hostname + 8);
    host = conf_get_str(*(Conf **)(proxy_hostname + 8),0);
    iVar3 = conf_get_int(*(Conf **)(proxy_hostname + 8),1);
    bVar1 = sp._1_1_;
    _Var2 = conf_get_bool(*(Conf **)(proxy_hostname + 8),8);
    realhost = backend_init((BackendVtable *)pcVar5,pSVar7,out,pLVar6,pCVar4,host,iVar3,&local_90,
                            (_Bool)(bVar1 & 1),_Var2);
    if (realhost == (char *)0x0) {
      safefree(local_90);
      if (clientitr != (Interactor *)0x0) {
        *(Interactor **)(proxy_hostname + 0x30) = clientitr;
        interactor_set_child
                  (*(Interactor **)(proxy_hostname + 0x30),
                   *(Interactor **)(*(long *)(proxy_hostname + 0x18) + 8));
        pLVar8 = interactor_logpolicy(clientitr);
        *(LogPolicy **)(proxy_hostname + 0x20) = pLVar8;
        if ((*(uint *)(subkey + 0xa8) & 8) != 0) {
          pSVar7 = interactor_borrow_seat(clientitr);
          *(Seat **)(proxy_hostname + 0x28) = pSVar7;
        }
      }
      addr_local = (SockAddr *)(proxy_hostname + 0x20a0);
    }
    else {
      pcVar5 = dupprintf("unable to open SSH proxy connection: %s",realhost);
      *(char **)proxy_hostname = pcVar5;
      addr_local = (SockAddr *)(proxy_hostname + 0x20a0);
    }
  }
  return (Socket *)addr_local;
}

Assistant:

Socket *sshproxy_new_connection(SockAddr *addr, const char *hostname,
                                int port, bool privport,
                                bool oobinline, bool nodelay, bool keepalive,
                                Plug *plug, Conf *clientconf,
                                Interactor *clientitr)
{
    SshProxy *sp = snew(SshProxy);
    memset(sp, 0, sizeof(*sp));

    sp->sock.vt = &SshProxy_sock_vt;
    sp->logpolicy.vt = &SshProxy_logpolicy_vt;
    sp->seat.vt = &SshProxy_seat_vt;
    sp->plug = plug;
    psb_init(&sp->psb);
    bufchain_init(&sp->ssh_to_socket);

    sp->addr = addr;
    sp->port = port;

    sp->conf = conf_new();
    /* Try to treat proxy_hostname as the title of a saved session. If
     * that fails, set up a default Conf of our own treating it as a
     * hostname. */
    const char *proxy_hostname = conf_get_str(clientconf, CONF_proxy_host);
    if (do_defaults(proxy_hostname, sp->conf)) {
        if (!conf_launchable(sp->conf)) {
            sp->errmsg = dupprintf("saved session '%s' is not launchable",
                                   proxy_hostname);
            return &sp->sock;
        }
    } else {
        do_defaults(NULL, sp->conf);
        /* In hostname mode, we default to PROT_SSH. This is more useful than
         * the obvious approach of defaulting to the protocol defined in
         * Default Settings, because only SSH (ok, and bare ssh-connection)
         * can be used for this kind of proxy. */
        conf_set_int(sp->conf, CONF_protocol, PROT_SSH);
        conf_set_str(sp->conf, CONF_host, proxy_hostname);
        conf_set_int(sp->conf, CONF_port,
                     conf_get_int(clientconf, CONF_proxy_port));
    }
    const char *proxy_username = conf_get_str(clientconf, CONF_proxy_username);
    if (*proxy_username)
        conf_set_str(sp->conf, CONF_username, proxy_username);

    const char *proxy_password = conf_get_str(clientconf, CONF_proxy_password);
    if (*proxy_password) {
        sp->proxy_password = dupstr(proxy_password);
        sp->got_proxy_password = true;
    }

    const struct BackendVtable *backvt = backend_vt_from_proto(
        conf_get_int(sp->conf, CONF_protocol));

    /*
     * We don't actually need an _SSH_ session specifically: it's also
     * OK to use PROT_SSHCONN, because really, the criterion is
     * whether setting CONF_ssh_nc_host will do anything useful. So
     * our check is for whether the backend sets the flag promising
     * that it does.
     */
    if (!backvt || !(backvt->flags & BACKEND_SUPPORTS_NC_HOST)) {
        sp->errmsg = dupprintf("saved session '%s' is not an SSH session",
                               proxy_hostname);
        return &sp->sock;
    }

    /*
     * We also expect that the backend will announce a willingness to
     * notify us that the session has started. Any backend providing
     * NC_HOST should also provide this.
     */
    assert(backvt->flags & BACKEND_NOTIFIES_SESSION_START &&
           "Backend provides NC_HOST without SESSION_START!");

    /*
     * Turn off SSH features we definitely don't want. It would be
     * awkward and counterintuitive to have the proxy SSH connection
     * become a connection-sharing upstream (but it's fine to have it
     * be a downstream, if that's configured). And we don't want to
     * open X forwardings, agent forwardings or (other) port
     * forwardings as a side effect of this one operation.
     */
    conf_set_bool(sp->conf, CONF_ssh_connection_sharing_upstream, false);
    conf_set_bool(sp->conf, CONF_x11_forward, false);
    conf_set_bool(sp->conf, CONF_agentfwd, false);
    for (const char *subkey;
         (subkey = conf_get_str_nthstrkey(sp->conf, CONF_portfwd, 0)) != NULL;)
        conf_del_str_str(sp->conf, CONF_portfwd, subkey);

    /*
     * We'll only be running one channel through this connection
     * (since we've just turned off all the other things we might have
     * done with it), so we can configure it as simple.
     */
    conf_set_bool(sp->conf, CONF_ssh_simple, true);

    int proxy_type = conf_get_int(clientconf, CONF_proxy_type);
    switch (proxy_type) {
      case PROXY_SSH_TCPIP:
        /*
         * Configure the main channel of this SSH session to be a
         * direct-tcpip connection to the destination host/port.
         */
        conf_set_str(sp->conf, CONF_ssh_nc_host, hostname);
        conf_set_int(sp->conf, CONF_ssh_nc_port, port);
        break;

      case PROXY_SSH_SUBSYSTEM:
      case PROXY_SSH_EXEC: {
        Conf *cmd_conf = conf_copy(clientconf);

        /*
         * Unlike the Telnet and Local proxy types, we don't use the
         * proxy username and password fields in the formatted
         * command, because if we use them at all, it's for
         * authenticating to the proxy SSH server.
         */
        conf_set_str(cmd_conf, CONF_proxy_username, "");
        conf_set_str(cmd_conf, CONF_proxy_password, "");

        char *cmd = format_telnet_command(sp->addr, sp->port, cmd_conf, NULL);
        conf_free(cmd_conf);

        conf_set_str(sp->conf, CONF_remote_cmd, cmd);
        sfree(cmd);

        conf_set_bool(sp->conf, CONF_nopty, true);

        if (proxy_type == PROXY_SSH_SUBSYSTEM)
            conf_set_bool(sp->conf, CONF_ssh_subsys, true);

        break;
      }

      default:
        unreachable("bad SSH proxy type");
    }

    /*
     * Do the usual normalisation of things in the Conf like a "user@"
     * prefix on the hostname field.
     */
    prepare_session(sp->conf);

    sp->logctx = log_init(&sp->logpolicy, sp->conf);

    char *error, *realhost;
    error = backend_init(backvt, &sp->seat, &sp->backend, sp->logctx, sp->conf,
                         conf_get_str(sp->conf, CONF_host),
                         conf_get_int(sp->conf, CONF_port),
                         &realhost, nodelay,
                         conf_get_bool(sp->conf, CONF_tcp_keepalives));
    if (error) {
        sp->errmsg = dupprintf("unable to open SSH proxy connection: %s",
                               error);
        return &sp->sock;
    }

    sfree(realhost);

    /*
     * If we've been given an Interactor by the caller, set ourselves
     * up to work with it.
     */
    if (clientitr) {
        sp->clientitr = clientitr;
        interactor_set_child(sp->clientitr, sp->backend->interactor);

        sp->clientlp = interactor_logpolicy(clientitr);

        /*
         * We can only borrow the client's Seat if our own backend
         * will tell us when to give it back. (SSH-based backends
         * _should_ do that, but we check the flag here anyway.)
         */
        if (backvt->flags & BACKEND_NOTIFIES_SESSION_START)
            sp->clientseat = interactor_borrow_seat(clientitr);
    }

    return &sp->sock;
}